

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::GetByte(I2cAnalyzer *this)

{
  value_type vVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 local_f0;
  uint local_bc;
  U32 i_1;
  U32 count;
  U8 address;
  bool is_read;
  bool ack;
  Frame frame;
  char *local_88;
  char *framev2Type;
  FrameV2 framev2;
  bool result;
  S64 last_valid_sample;
  U64 scl_rising_edge;
  undefined4 local_58;
  BitState ack_bit_state;
  U64 UStack_50;
  bool result_1;
  U64 scl_rising_edge_1;
  BitState bit_state;
  U32 i;
  U64 potential_ending_sample;
  U64 starting_sample;
  DataBuilder local_20 [8];
  DataBuilder byte;
  U64 value;
  I2cAnalyzer *this_local;
  
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            (&this->mArrowLocations);
  DataBuilder::DataBuilder(local_20);
  DataBuilder::Reset((ulonglong *)local_20,(ShiftOrder)&byte,0);
  potential_ending_sample = 0;
  _bit_state = 0;
  scl_rising_edge_1._4_4_ = 0;
  do {
    if (7 < scl_rising_edge_1._4_4_) {
      local_f0 = AnalyzerChannelData::GetSampleNumber();
      bVar2 = GetBitPartOne(this,(BitState *)((long)&scl_rising_edge + 4),(U64 *)&last_valid_sample,
                            (U64 *)&bit_state);
      FrameV2::FrameV2((FrameV2 *)&framev2Type);
      Frame::Frame((Frame *)&count);
      _count = potential_ending_sample;
      if (bVar2) {
        local_f0 = _bit_state;
      }
      _frame = local_f0;
      if (bVar2) {
        FrameV2::AddBoolean((char *)&framev2Type,true);
      }
      else {
        FrameV2::AddString((char *)&framev2Type,"error");
      }
      if (((this->mNeedAddress & 1U) == 1) && (bVar2)) {
        this->mNeedAddress = false;
        local_88 = "address";
        FrameV2::AddByte((char *)&framev2Type,'\x1a');
        FrameV2::AddBoolean((char *)&framev2Type,true);
      }
      else {
        local_88 = "data";
        FrameV2::AddByte((char *)&framev2Type,'\'');
      }
      peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)peVar3);
      peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrameV2
                ((FrameV2 *)peVar3,(char *)&framev2Type,(ulonglong)local_88,potential_ending_sample)
      ;
      sVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                        (&this->mArrowLocations);
      for (local_bc = 0; local_bc < (uint)sVar4; local_bc = local_bc + 1) {
        peVar3 = std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
        pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (&this->mArrowLocations,(ulong)local_bc);
        vVar1 = *pvVar5;
        std::auto_ptr<I2cAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar3,(MarkerType)vVar1,(Channel *)0x4);
      }
      std::auto_ptr<I2cAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::CommitResults();
      GetBitPartTwo(this);
      Frame::~Frame((Frame *)&count);
      FrameV2::~FrameV2((FrameV2 *)&framev2Type);
      local_58 = 0;
LAB_001086f7:
      DataBuilder::~DataBuilder(local_20);
      return;
    }
    ack_bit_state._3_1_ =
         GetBitPartOne(this,(BitState *)&scl_rising_edge_1,&stack0xffffffffffffffb0,
                       (U64 *)&bit_state);
    bVar2 = GetBitPartTwo(this);
    ack_bit_state._3_1_ = (ack_bit_state._3_1_ & 1 & bVar2) != BIT_LOW >> 0x18;
    if (!(bool)ack_bit_state._3_1_) {
      local_58 = 1;
      goto LAB_001086f7;
    }
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              (&this->mArrowLocations,&stack0xffffffffffffffb0);
    DataBuilder::AddBit((BitState)local_20);
    if (scl_rising_edge_1._4_4_ == 0) {
      potential_ending_sample = UStack_50;
    }
    scl_rising_edge_1._4_4_ = scl_rising_edge_1._4_4_ + 1;
  } while( true );
}

Assistant:

void I2cAnalyzer::GetByte()
{
    mArrowLocations.clear();
    U64 value;
    DataBuilder byte;
    byte.Reset( &value, AnalyzerEnums::MsbFirst, 8 );
    U64 starting_sample = 0;
    U64 potential_ending_sample = 0;

    for( U32 i = 0; i < 8; i++ )
    {
        BitState bit_state;
        U64 scl_rising_edge;
        bool result = GetBitPartOne( bit_state, scl_rising_edge, potential_ending_sample );
        result &= GetBitPartTwo();
        if( result == true )
        {
            mArrowLocations.push_back( scl_rising_edge );
            byte.AddBit( bit_state );

            if( i == 0 )
                starting_sample = scl_rising_edge;
        }
        else
        {
            return;
        }
    }

    BitState ack_bit_state;
    U64 scl_rising_edge;
    S64 last_valid_sample = mScl->GetSampleNumber();
    bool result = GetBitPartOne( ack_bit_state, scl_rising_edge, potential_ending_sample ); // GetBit( ack_bit_state, scl_rising_edge );

    FrameV2 framev2;
    char* framev2Type = nullptr;

    Frame frame;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = result ? potential_ending_sample : last_valid_sample;
    frame.mData1 = U8( value );

    if( !result )
    {
        framev2.AddString( "error", "missing ack/nak" );
        frame.mFlags = I2C_MISSING_FLAG_ACK;
    }
    else
    {
        bool ack = ack_bit_state == BIT_LOW;

        // true == ack, false == nak
        framev2.AddBoolean( "ack", ack );
        if( ack )
        {
            frame.mFlags = I2C_FLAG_ACK;
        }
    }

    if( mNeedAddress == true && result == true ) // if result is false, then we have already recorded a stop bit and toggled mNeedAddress
    {
        mNeedAddress = false;
        bool is_read = value & 0x01;
        U8 address = value >> 1;
        frame.mType = I2cAddress;
        framev2Type = "address";
        framev2.AddByte( "address", address );
        framev2.AddBoolean( "read", is_read );
    }
    else
    {
        frame.mType = I2cData;
        framev2Type = "data";
        framev2.AddByte( "data", value );
    }

    mResults->AddFrame( frame );
    mResults->AddFrameV2( framev2, framev2Type, starting_sample, result ? potential_ending_sample : last_valid_sample );

    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
    {
        mResults->AddMarker( mArrowLocations[ i ], AnalyzerResults::UpArrow, mSettings->mSclChannel );
    }

    mResults->CommitResults();

    result &= GetBitPartTwo();
}